

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

UpVal ** getupvalref(lua_State *L,int fidx,int n,LClosure **pf,ravi_type_map *type)

{
  LClosure *pLVar1;
  TValue *pTVar2;
  
  pTVar2 = index2addr(L,fidx);
  if (pTVar2->tt_ != 0x8006) {
    __assert_fail("(((((fi))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))) && \"Lua function expected\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x676,"UpVal **getupvalref(lua_State *, int, int, LClosure **, ravi_type_map *)")
    ;
  }
  pLVar1 = (LClosure *)(pTVar2->value_).f;
  if ((code)pLVar1->tt == (code)0x6) {
    if ((0 < n) && (n <= pLVar1->p->sizeupvalues)) {
      if (type != (ravi_type_map *)0x0) {
        *type = pLVar1->p->upvalues[(ulong)(uint)n - 1].ravi_type_map;
      }
      if (pf != (LClosure **)0x0) {
        *pf = pLVar1;
      }
      return pLVar1->upvals + (n - 1);
    }
    __assert_fail("((1 <= n && n <= f->p->sizeupvalues)) && \"invalid upvalue index\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x678,"UpVal **getupvalref(lua_State *, int, int, LClosure **, ravi_type_map *)")
    ;
  }
  __assert_fail("(((fi)->value_).gc)->tt == ((6) | ((0) << 4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x677,"UpVal **getupvalref(lua_State *, int, int, LClosure **, ravi_type_map *)");
}

Assistant:

static UpVal **getupvalref (lua_State *L, int fidx, int n, LClosure **pf, ravi_type_map *type) {
  LClosure *f;
  StkId fi = index2addr(L, fidx);
  api_check(L, ttisLclosure(fi), "Lua function expected");
  f = clLvalue(fi);
  api_check(L, (1 <= n && n <= f->p->sizeupvalues), "invalid upvalue index");
  if (type) *type = f->p->upvalues[n - 1].ravi_type_map;
  if (pf) *pf = f;
  return &f->upvals[n - 1];  /* get its upvalue pointer */
}